

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_setHighsOutput(void *highs,void *outputfile)

{
  HighsStatus HVar1;
  string *in_RDI;
  undefined4 in_stack_ffffffffffffff3c;
  Highs *pHVar2;
  string *alt_method_name;
  undefined1 local_91 [40];
  undefined1 local_69 [56];
  undefined1 local_31 [41];
  string *local_8;
  
  pHVar2 = (Highs *)local_31;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"Highs_setHighsOutput",(allocator *)pHVar2);
  alt_method_name = (string *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_69 + 1),"None",(allocator *)alt_method_name);
  Highs::deprecationMessage(pHVar2,in_RDI,alt_method_name);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  pHVar2 = (Highs *)local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_91 + 1),"output_flag",(allocator *)pHVar2);
  HVar1 = Highs::setOptionValue(pHVar2,local_8,SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  return HVar1;
}

Assistant:

HighsInt Highs_setHighsOutput(void* highs, const void* outputfile) {
  ((Highs*)highs)->deprecationMessage("Highs_setHighsOutput", "None");
  return (HighsInt)((Highs*)highs)->setOptionValue("output_flag", false);
}